

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O2

void __thiscall efsw::DirectorySnapshot::addFile(DirectorySnapshot *this,string *path)

{
  mapped_type *this_00;
  string name;
  string sStack_a8;
  string local_88;
  FileInfo local_68;
  
  std::__cxx11::string::string((string *)&local_88,(string *)path);
  FileSystem::fileNameFromPath(&sStack_a8,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  FileInfo::FileInfo(&local_68,path);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
            ::operator[](&this->Files,&sStack_a8);
  FileInfo::operator=(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&sStack_a8);
  return;
}

Assistant:

void DirectorySnapshot::addFile( std::string path ) {
	std::string name( FileSystem::fileNameFromPath( path ) );
	Files[name] = FileInfo( path );
}